

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

LY_ERR plugins_insert(ly_ctx *ctx,LYPLG type,void *recs)

{
  LY_ERR LVar1;
  long lVar2;
  lyplg_ext_record *rec;
  ulong uVar3;
  void *pvVar4;
  ly_set *plVar5;
  
  if (recs != (void *)0x0) {
    if (type == LYPLG_EXTENSION) {
      plVar5 = &plugins_extensions;
      if (ctx != (ly_ctx *)0x0) {
        plVar5 = &ctx->plugins_extensions;
      }
      if (*(long *)((long)recs + 0x10) == 0) {
        return LY_SUCCESS;
      }
      uVar3 = 1;
      pvVar4 = recs;
      do {
        LVar1 = ly_set_add(plVar5,pvVar4,'\0',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        lVar2 = uVar3 * 0x70;
        pvVar4 = (void *)((long)recs + lVar2);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (*(long *)((long)recs + lVar2 + 0x10) != 0);
    }
    else {
      plVar5 = &plugins_types;
      if (ctx != (ly_ctx *)0x0) {
        plVar5 = &ctx->plugins_types;
      }
      if (*(long *)((long)recs + 0x10) == 0) {
        return LY_SUCCESS;
      }
      uVar3 = 1;
      pvVar4 = recs;
      do {
        LVar1 = ly_set_add(plVar5,pvVar4,'\0',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        lVar2 = uVar3 * 0x60;
        pvVar4 = (void *)((long)recs + lVar2);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (*(long *)((long)recs + lVar2 + 0x10) != 0);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
plugins_insert(struct ly_ctx *ctx, enum LYPLG type, const void *recs)
{
    struct ly_set *plugins;

    if (!recs) {
        return LY_SUCCESS;
    }

    if (type == LYPLG_EXTENSION) {
        const struct lyplg_ext_record *rec = (const struct lyplg_ext_record *)recs;

        plugins = ctx ? &ctx->plugins_extensions : &plugins_extensions;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    } else { /* LYPLG_TYPE */
        const struct lyplg_type_record *rec = (const struct lyplg_type_record *)recs;

        plugins = ctx ? &ctx->plugins_types : &plugins_types;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    }

    return LY_SUCCESS;
}